

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O2

bool GetDiscardMove(int card_index,pyhanabi_move_t *move)

{
  undefined4 *puVar1;
  
  if (move != (pyhanabi_move_t *)0x0) {
    puVar1 = (undefined4 *)operator_new(8);
    *puVar1 = 2;
    *(char *)(puVar1 + 1) = (char)card_index;
    *(undefined2 *)((long)puVar1 + 5) = 0xffff;
    *(undefined1 *)((long)puVar1 + 7) = 0xff;
    move->move = puVar1;
    return true;
  }
  __assert_fail("move != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0xa9,"bool GetDiscardMove(int, pyhanabi_move_t *)");
}

Assistant:

bool GetDiscardMove(int card_index, pyhanabi_move_t* move) {
  REQUIRE(move != nullptr);
  move->move = new hanabi_learning_env::HanabiMove(
      hanabi_learning_env::HanabiMove::kDiscard, card_index, -1, -1, -1);
  return move->move != nullptr;
}